

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sensors_analytics_sdk.cpp
# Opt level: O2

bool sensors_analytics::HttpSender::EncodeToRequestBody(string *data,string *request_body)

{
  bool bVar1;
  string compressed_data;
  string local_98;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_78;
  string base64_encoded_data;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  
  compressed_data._M_dataplus._M_p = (pointer)&compressed_data.field_2;
  compressed_data._M_string_length = 0;
  compressed_data.field_2._M_local_buf[0] = '\0';
  bVar1 = CompressString(data,&compressed_data,9);
  if (bVar1) {
    Base64Encode(&base64_encoded_data,&compressed_data);
    utils::UrlEncode(&local_98,&base64_encoded_data);
    std::operator+(&local_78,"data_list=",&local_98);
    std::operator+(&local_38,&local_78,"&gzip=1");
    std::__cxx11::string::operator=((string *)request_body,(string *)&local_38);
    std::__cxx11::string::~string((string *)&local_38);
    std::__cxx11::string::~string((string *)&local_78);
    std::__cxx11::string::~string((string *)&local_98);
    std::__cxx11::string::~string((string *)&base64_encoded_data);
  }
  std::__cxx11::string::~string((string *)&compressed_data);
  return bVar1;
}

Assistant:

bool HttpSender::EncodeToRequestBody(const string &data, string *request_body) {
  string compressed_data;
  if (!CompressString(data, &compressed_data)) {
    return false;
  }
  const string base64_encoded_data = Base64Encode(compressed_data);
  *request_body = "data_list=" + utils::UrlEncode(base64_encoded_data) + "&gzip=1";
  return true;
}